

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<_drmModeModeInfo>::reserve(QList<_drmModeModeInfo> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  _drmModeModeInfo *__dest;
  long lVar5;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if ((pDVar2 != (Data *)0x0) &&
     (asize <= ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 2) * 0xf0f0f0f0f0f0f0f + (pDVar2->super_QArrayData).alloc)) {
    if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) goto LAB_0011d4c6;
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      goto LAB_0011d4c6;
    }
  }
  lVar5 = (this->d).size;
  if (asize < lVar5) {
    asize = lVar5;
  }
  local_30 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  __dest = (_drmModeModeInfo *)QArrayData::allocate(&local_30,0x44,0x10,asize,KeepSize);
  pQVar4 = local_30;
  lVar5 = (this->d).size;
  if (lVar5 == 0) {
    lVar5 = 0;
  }
  else {
    memcpy(__dest,(this->d).ptr,lVar5 * 0x44);
  }
  if (pQVar4 != (QArrayData *)0x0) {
    *(byte *)&(pQVar4->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pQVar4->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pQVar3 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)pQVar4;
  (this->d).ptr = __dest;
  (this->d).size = lVar5;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,0x44,0x10);
    }
  }
LAB_0011d4c6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}